

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall
Minisat::Solver::simplifyLearnt<Minisat::vec<Minisat::Lit>>(Solver *this,vec<Minisat::Lit> *c)

{
  vec<Minisat::Lit> *this_00;
  uint64_t *puVar1;
  byte bVar2;
  Lit *pLVar3;
  lbool *plVar4;
  VarData *pVVar5;
  Lit *pLVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  CRef confl;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int local_64;
  int local_4c;
  vec<unsigned_int> *local_48;
  ulong local_40;
  vec<int> *local_38;
  
  uVar13 = (ulong)c->sz;
  this->original_length_record = this->original_length_record + uVar13;
  this->trailRecord = (this->trail).sz;
  this->LCM_total_tries = this->LCM_total_tries + 1;
  local_38 = &this->trail_lim;
  this_00 = &this->simp_learnt_clause;
  local_48 = &this->simp_reason_clause;
  bVar8 = true;
  bVar9 = false;
  local_64 = 0;
  local_40 = uVar13;
  do {
    iVar12 = (int)uVar13;
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + 1;
    if (!bVar8) {
      if (iVar12 == 1) {
        uVar10 = 1;
LAB_0011e769:
        if (bVar9 == true && 1 < (int)uVar10) {
LAB_0011e77d:
          pLVar3 = c->data;
          lVar14 = 0;
          lVar11 = (ulong)uVar10 - 2;
          do {
            iVar12 = pLVar3[lVar14].x;
            pLVar3[lVar14].x = pLVar3[lVar11 + 1].x;
            pLVar3[lVar11 + 1].x = iVar12;
            lVar14 = lVar14 + 1;
            bVar8 = lVar14 < lVar11;
            lVar11 = lVar11 + -1;
          } while (bVar8);
          uVar10 = c->sz;
        }
LAB_0011e7a9:
        this->LCM_successful_tries = this->LCM_successful_tries + (ulong)((uint)local_40 != uVar10);
        return;
      }
      if (1 < iVar12) {
        pLVar3 = c->data;
        lVar14 = 0;
        lVar11 = (uVar13 & 0xffffffff) - 2;
        do {
          iVar12 = pLVar3[lVar14].x;
          pLVar3[lVar14].x = pLVar3[lVar11 + 1].x;
          pLVar3[lVar11 + 1].x = iVar12;
          lVar14 = lVar14 + 1;
          bVar7 = lVar14 < lVar11;
          lVar11 = lVar11 + -1;
        } while (bVar7);
        iVar12 = c->sz;
      }
      bVar9 = (bool)(bVar9 ^ 1);
      local_64 = iVar12;
    }
    local_4c = (this->trail).sz;
    vec<int>::push(local_38,&local_4c);
    iVar12 = c->sz;
    if (iVar12 < 1) {
      iVar16 = 0;
    }
    else {
      lVar11 = 0;
      iVar16 = 0;
      do {
        pLVar3 = c->data;
        uVar10 = pLVar3[lVar11].x;
        iVar15 = (int)uVar10 >> 1;
        plVar4 = (this->assigns).data;
        bVar2 = plVar4[iVar15].value;
        if ((bVar2 & 2) == 0) {
          if (bVar2 == ((byte)uVar10 & 1)) {
            lVar14 = (long)iVar16;
            iVar16 = iVar16 + 1;
            pLVar3[lVar14].x = uVar10;
            bVar7 = true;
            confl = (this->vardata).data[pLVar3[lVar11].x >> 1].reason;
            goto LAB_0011e60a;
          }
        }
        else {
          plVar4[iVar15].value = (byte)(uVar10 ^ 1) & 1;
          pVVar5 = (this->vardata).data;
          pVVar5[iVar15].reason = 0xffffffff;
          pVVar5[iVar15].level = (this->trail_lim).sz;
          iVar12 = (this->trail).sz;
          (this->trail).sz = iVar12 + 1;
          (this->trail).data[iVar12].x = uVar10 ^ 1;
          lVar14 = (long)iVar16;
          iVar16 = iVar16 + 1;
          c->data[lVar14].x = c->data[lVar11].x;
          confl = simplePropagate(this);
          if (confl != 0xffffffff) {
            bVar7 = false;
            goto LAB_0011e60a;
          }
          iVar12 = c->sz;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar12);
    }
    bVar7 = false;
    confl = 0xffffffff;
LAB_0011e60a:
    if (iVar16 < c->sz) {
      c->sz = iVar16;
    }
    if (!(bool)(confl == 0xffffffff & (bVar7 ^ 1U))) {
      if (this_00->data != (Lit *)0x0) {
        (this->simp_learnt_clause).sz = 0;
      }
      if (local_48->data != (uint *)0x0) {
        (this->simp_reason_clause).sz = 0;
      }
      if (bVar7 != false) {
        vec<Minisat::Lit>::push(this_00,c->data + (long)c->sz + -1);
      }
      simpleAnalyze(this,confl,this_00,local_48,bVar7);
      iVar12 = (this->simp_learnt_clause).sz;
      iVar16 = c->sz;
      if (iVar12 < iVar16) {
        if (iVar12 < 1) {
          lVar11 = 0;
        }
        else {
          pLVar3 = this_00->data;
          pLVar6 = c->data;
          lVar11 = 0;
          do {
            pLVar6[lVar11].x = pLVar3[lVar11].x;
            lVar11 = lVar11 + 1;
          } while (lVar11 < (this->simp_learnt_clause).sz);
          iVar16 = c->sz;
        }
        if ((int)lVar11 < iVar16) {
          c->sz = (int)lVar11;
        }
      }
    }
    cancelUntil(this,0,false);
    cancelUntilTrailRecord(this);
    uVar10 = c->sz;
    uVar13 = (ulong)(int)uVar10;
    this->simplified_length_record = this->simplified_length_record + uVar13;
    iVar12 = (int)local_40 - uVar10;
    if ((iVar12 == 0) || ((int)uVar10 < 2)) goto LAB_0011e769;
    this->LCM_dropped_lits = this->LCM_dropped_lits + (long)iVar12;
    if (bVar8 == false) {
      this->LCM_dropped_reverse = this->LCM_dropped_reverse + (long)(int)(local_64 - uVar10);
      if (!bVar9) goto LAB_0011e7a9;
      goto LAB_0011e77d;
    }
    bVar2 = this->reverse_LCM & bVar8;
    bVar8 = false;
    if (bVar2 == 0) goto LAB_0011e769;
  } while( true );
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}